

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_setcond_i32_ppc64
               (TCGContext_conflict10 *tcg_ctx,TCGCond cond,TCGv_i32 ret,TCGv_i32 arg1,TCGv_i32 arg2
               )

{
  TCGOp *pTVar1;
  int32_t arg;
  uintptr_t o;
  uintptr_t o_1;
  
  if (cond == TCG_COND_NEVER) {
    arg = 0;
  }
  else {
    if (cond != TCG_COND_ALWAYS) {
      pTVar1 = tcg_emit_op_ppc64(tcg_ctx,INDEX_op_setcond_i32);
      pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
      pTVar1->args[1] = (TCGArg)(arg1 + (long)tcg_ctx);
      pTVar1->args[2] = (TCGArg)(arg2 + (long)tcg_ctx);
      pTVar1->args[3] = (ulong)cond;
      return;
    }
    arg = 1;
  }
  tcg_gen_movi_i32(tcg_ctx,ret,arg);
  return;
}

Assistant:

void tcg_gen_setcond_i32(TCGContext *tcg_ctx, TCGCond cond, TCGv_i32 ret,
                         TCGv_i32 arg1, TCGv_i32 arg2)
{
    if (cond == TCG_COND_ALWAYS) {
        tcg_gen_movi_i32(tcg_ctx, ret, 1);
    } else if (cond == TCG_COND_NEVER) {
        tcg_gen_movi_i32(tcg_ctx, ret, 0);
    } else {
        tcg_gen_op4i_i32(tcg_ctx, INDEX_op_setcond_i32, ret, arg1, arg2, cond);
    }
}